

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int __thiscall
fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>::next_arg_id
          (basic_format_parse_context<char,_fmt::v9::detail::error_handler> *this)

{
  int iVar1;
  
  iVar1 = this->next_arg_id_;
  if (-1 < iVar1) {
    this->next_arg_id_ = iVar1 + 1;
    return iVar1;
  }
  detail::throw_format_error("cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    if (next_arg_id_ < 0) {
      on_error("cannot switch from manual to automatic argument indexing");
      return 0;
    }
    int id = next_arg_id_++;
    do_check_arg_id(id);
    return id;
  }